

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void transformTest(void)

{
  ostream *poVar1;
  long lVar2;
  long lVar3;
  array<int,_8UL> *__dest;
  array<float,_8UL> *paVar4;
  float fVar5;
  array<std::array<float,_8UL>,_8UL> coeff;
  array<std::array<int,_8UL>,_8UL> mat;
  array<std::array<float,_8UL>,_8UL> icoeff;
  array<std::array<float,_8UL>,_8UL> local_328;
  array<std::array<int,_8UL>,_8UL> local_228;
  array<float,_8UL> local_128 [8];
  
  __dest = local_228._M_elems;
  memcpy(__dest,&DAT_00133bf4,0x100);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Original block:-",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  lVar2 = 0;
  do {
    lVar2 = lVar2 + 0x20;
    lVar3 = 0;
    do {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         (&std::cout,
                          *(int *)((long)((array<int,_8UL> *)__dest->_M_elems)->_M_elems + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    __dest = __dest + 1;
  } while (lVar2 != 0x100);
  paVar4 = local_328._M_elems;
  DCTTest((array<std::array<float,_8UL>,_8UL> *)paVar4,&local_228);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nAfter DCT:-",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  lVar2 = 0;
  do {
    lVar2 = lVar2 + 0x20;
    lVar3 = 0;
    do {
      poVar1 = std::ostream::_M_insert<double>
                         ((double)*(float *)((long)((array<float,_8UL> *)paVar4->_M_elems)->_M_elems
                                            + lVar3));
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    paVar4 = paVar4 + 1;
  } while (lVar2 != 0x100);
  paVar4 = local_128;
  IDCTTest((array<std::array<float,_8UL>,_8UL> *)paVar4,&local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\nAfter IDCT:-",0xd);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
  std::ostream::put('8');
  std::ostream::flush();
  lVar2 = 0;
  do {
    lVar2 = lVar2 + 0x20;
    lVar3 = 0;
    do {
      fVar5 = roundf(*(float *)((long)((array<float,_8UL> *)paVar4->_M_elems)->_M_elems + lVar3));
      poVar1 = std::ostream::_M_insert<long_double>((longdouble)fVar5);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '8');
    std::ostream::put('8');
    std::ostream::flush();
    paVar4 = paVar4 + 1;
  } while (lVar2 != 0x100);
  return;
}

Assistant:

void transformTest()
{
    std::array<std::array<int, 8>, 8> mat 
    {
        std::array<int, 8>{ 52, 55, 61, 66, 70, 61, 64, 73 },
        std::array<int, 8>{ 63, 59, 55, 90, 109, 85, 69, 72 },
        std::array<int, 8>{ 62, 59, 68, 113, 144, 104, 66, 73 },
        std::array<int, 8>{ 63, 58, 71, 122, 154, 106, 70, 69 },
        std::array<int, 8>{ 67, 61, 68, 104, 126, 88, 68, 70 },
        std::array<int, 8>{ 79, 65, 60, 70, 77, 68, 58, 75 },
        std::array<int, 8>{ 85, 71, 64, 59, 55, 61, 65, 83 },
        std::array<int, 8>{ 87, 79, 69, 68, 65, 76, 78, 94 }
    };
    
    std::cout << "Original block:-" << std::endl;
    for (auto&& row: mat )
    {
        for ( auto&& v : row )
            std::cout << v << "\t";
        std::cout << std::endl;
    }
    
    auto coeff = DCTTest( mat );
    
    std::cout << "\nAfter DCT:-" << std::endl;
    
    for (auto&& row: coeff )
    {
        for ( auto&& v : row )
            std::cout << v << "\t";
        std::cout << std::endl;
    }
    
    auto icoeff = IDCTTest( coeff );
    
    std::cout << "\nAfter IDCT:-" << std::endl;
    
    for (auto&& row: icoeff )
    {
        for ( auto&& v : row )
            std::cout << std::roundl( v ) << "\t";
        std::cout << std::endl;
    }
}